

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
insert(storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this,
      local_context *ctx,bit_array *x,size_t hash,int remaining_constraints,double duration,
      long loop)

{
  baryonyx *pbVar1;
  size_t x_00;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  double value;
  string_view fmt;
  string_view fmt_00;
  double *args_1;
  long *in_stack_ffffffffffffff58;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  int local_54;
  undefined1 auStack_50 [4];
  int id_to_delete;
  char *local_48;
  double local_40;
  long loop_local;
  double duration_local;
  size_t sStack_28;
  int remaining_constraints_local;
  size_t hash_local;
  bit_array *x_local;
  local_context *ctx_local;
  storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this_local;
  
  pbVar1 = _stdout;
  local_40 = (double)loop;
  loop_local = (long)duration;
  duration_local._4_4_ = remaining_constraints;
  sStack_28 = hash;
  hash_local = (size_t)x;
  x_local = (bit_array *)ctx;
  ctx_local = (local_context *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_50,
             "- insert advance {} (hash: {}) {}s in {} loops\n");
  args_1 = (double *)&loop_local;
  fmt._M_str = (char *)((long)&duration_local + 4);
  fmt._M_len = (size_t)local_48;
  to_log<int,unsigned_long,double,long>
            (pbVar1,(FILE *)0x5,(uint)auStack_50,fmt,(int *)&stack0xffffffffffffffd8,
             (unsigned_long *)args_1,&local_40,in_stack_ffffffffffffff58);
  iVar2 = choose_a_bad_solution(this,(local_context *)x_local);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_indices,(long)iVar2);
  pbVar1 = _stdout;
  local_54 = *pvVar3;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,"- delete {} ({})\n");
  pvVar4 = std::
           vector<baryonyx::raw_result<baryonyx::itm::maximize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::maximize_tag>_>_>
           ::operator[](&this->m_data,(long)local_54);
  fmt_00._M_str = (char *)&local_54;
  fmt_00._M_len = (size_t)local_68._M_str;
  to_log<int,double>(pbVar1,(FILE *)0x5,(uint)local_68._M_len,fmt_00,(int *)&pvVar4->value,args_1);
  x_00 = hash_local;
  iVar2 = local_54;
  value = default_cost_type<long_double>::results
                    (this->costs,(bit_array *)hash_local,this->cost_constant);
  replace_result(this,iVar2,(bit_array *)x_00,value,(double)loop_local,sStack_28,(long)local_40,
                 duration_local._4_4_);
  sort(this);
  return;
}

Assistant:

void insert(local_context& ctx,
                const bit_array& x,
                const std::size_t hash,
                const int remaining_constraints,
                const double duration,
                const long int loop) noexcept
    {
        to_log(stdout,
               5u,
               "- insert advance {} (hash: {}) {}s in {} loops\n",
               remaining_constraints,
               hash,
               duration,
               loop);

        int id_to_delete = m_indices[choose_a_bad_solution(ctx)];

        to_log(stdout,
               5u,
               "- delete {} ({})\n",
               id_to_delete,
               m_data[id_to_delete].value);

        replace_result(id_to_delete,
                       x,
                       costs.results(x, cost_constant),
                       duration,
                       hash,
                       loop,
                       remaining_constraints);

        sort();
    }